

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O1

void __thiscall Safaia::Log::Log(Log *this)

{
  int iVar1;
  
  iVar1 = fileno(_stdout);
  iVar1 = isatty(iVar1);
  this->is_stdout = iVar1;
  (this->str_reset)._M_dataplus._M_p = (pointer)&(this->str_reset).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->str_reset,"\x1b[0m","");
  (this->str_green)._M_dataplus._M_p = (pointer)&(this->str_green).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->str_green,"\x1b[32m","");
  (this->str_yellow)._M_dataplus._M_p = (pointer)&(this->str_yellow).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->str_yellow,"\x1b[33m","");
  (this->str_red)._M_dataplus._M_p = (pointer)&(this->str_red).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->str_red,"\x1b[1m\x1b[31m","");
  this->ansi_color = true;
  this->level = 3;
  return;
}

Assistant:

Log(){
            
        }